

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::~RandomFragmentOpCase(RandomFragmentOpCase *this)

{
  QuadRenderer *this_00;
  TextureLevel *pTVar1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RandomFragmentOpCase_0071cbd0;
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
  }
  operator_delete(this_00,0x20);
  pTVar1 = this->m_refColorBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
  }
  operator_delete(pTVar1,0x28);
  pTVar1 = this->m_refDepthBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
  }
  operator_delete(pTVar1,0x28);
  pTVar1 = this->m_refStencilBuffer;
  if (pTVar1 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(pTVar1);
  }
  operator_delete(pTVar1,0x28);
  operator_delete(this->m_refRenderer,0x11108);
  glu::CallLogWrapper::~CallLogWrapper(&this->m_callLogWrapper);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

RandomFragmentOpCase::~RandomFragmentOpCase (void)
{
	delete m_renderer;
	delete m_refColorBuffer;
	delete m_refDepthBuffer;
	delete m_refStencilBuffer;
	delete m_refRenderer;
}